

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbr2_probe_bw.cc
# Opt level: O0

void __thiscall
quic::Bbr2ProbeBwMode::UpdateProbeDown
          (Bbr2ProbeBwMode *this,QuicByteCount prior_in_flight,Bbr2CongestionEvent *congestion_event
          )

{
  Bbr2NetworkModel *this_00;
  bool bVar1;
  QuicByteCount QVar2;
  QuicBandwidth bandwidth;
  QuicByteCount bdp;
  QuicByteCount inflight_with_headroom;
  Bbr2CongestionEvent *congestion_event_local;
  QuicByteCount prior_in_flight_local;
  Bbr2ProbeBwMode *this_local;
  
  if (((this->cycle_).rounds_in_phase == 1) && ((congestion_event->end_of_round_trip & 1U) != 0)) {
    (this->cycle_).is_sample_from_probing = false;
    if ((congestion_event->last_sample_is_app_limited & 1U) == 0) {
      Bbr2NetworkModel::AdvanceMaxBandwidthFilter((this->super_Bbr2ModeBase).model_);
      (this->cycle_).has_advanced_max_bw = true;
    }
    if (((this->last_cycle_stopped_risky_probe_ & 1U) != 0) &&
       ((this->last_cycle_probed_too_high_ & 1U) == 0)) {
      EnterProbeRefill(this,0,(QuicTime)(congestion_event->event_time).time_);
      return;
    }
  }
  MaybeAdaptUpperBounds(this,congestion_event);
  bVar1 = IsTimeToProbeBandwidth(this,congestion_event);
  if (bVar1) {
    EnterProbeRefill(this,0,(QuicTime)(congestion_event->event_time).time_);
  }
  else {
    bVar1 = HasStayedLongEnoughInProbeDown(this,congestion_event);
    if (bVar1) {
      EnterProbeCruise(this,(QuicTime)(congestion_event->event_time).time_);
    }
    else {
      QVar2 = Bbr2NetworkModel::inflight_hi_with_headroom((this->super_Bbr2ModeBase).model_);
      if (prior_in_flight <= QVar2) {
        this_00 = (this->super_Bbr2ModeBase).model_;
        bandwidth = Bbr2NetworkModel::MaxBandwidth((this->super_Bbr2ModeBase).model_);
        QVar2 = Bbr2NetworkModel::BDP(this_00,bandwidth);
        if (prior_in_flight < QVar2) {
          EnterProbeCruise(this,(QuicTime)(congestion_event->event_time).time_);
        }
      }
    }
  }
  return;
}

Assistant:

void Bbr2ProbeBwMode::UpdateProbeDown(
    QuicByteCount prior_in_flight,
    const Bbr2CongestionEvent& congestion_event) {
  //DCHECK_EQ(cycle_.phase, CyclePhase::PROBE_DOWN);

  if (cycle_.rounds_in_phase == 1 && congestion_event.end_of_round_trip) {
    cycle_.is_sample_from_probing = false;

    if (!congestion_event.last_sample_is_app_limited) {
    /*  QUIC_DVLOG(2)
          << sender_
          << " Advancing max bw filter after one round in PROBE_DOWN.";*/
      model_->AdvanceMaxBandwidthFilter();
      cycle_.has_advanced_max_bw = true;
    }

    if (last_cycle_stopped_risky_probe_ && !last_cycle_probed_too_high_) {
      EnterProbeRefill(/*probe_up_rounds=*/0, congestion_event.event_time);
      return;
    }
  }

  MaybeAdaptUpperBounds(congestion_event);

  if (IsTimeToProbeBandwidth(congestion_event)) {
    EnterProbeRefill(/*probe_up_rounds=*/0, congestion_event.event_time);
    return;
  }

  if (HasStayedLongEnoughInProbeDown(congestion_event)) {
   // QUIC_DVLOG(3) << sender_ << " Proportional time based PROBE_DOWN exit";
    EnterProbeCruise(congestion_event.event_time);
    return;
  }

  const QuicByteCount inflight_with_headroom =
      model_->inflight_hi_with_headroom();
 /* QUIC_DVLOG(3)
      << sender_
      << " Checking if have enough inflight headroom. prior_in_flight:"
      << prior_in_flight
      << ", inflight_with_headroom:" << inflight_with_headroom;*/
  if (prior_in_flight > inflight_with_headroom) {
    // Stay in PROBE_DOWN.
    return;
  }

  // Transition to PROBE_CRUISE iff we've drained to target.
  QuicByteCount bdp = model_->BDP(model_->MaxBandwidth());
 /* QUIC_DVLOG(3) << sender_ << " Checking if drained to target. prior_in_flight:"
                << prior_in_flight << ", bdp:" << bdp;*/
  if (prior_in_flight < bdp) {
    EnterProbeCruise(congestion_event.event_time);
  }
}